

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O0

int nghttp2_http_on_header
              (nghttp2_session *session,nghttp2_stream *stream,nghttp2_frame *frame,
              nghttp2_hd_nv *nv,int trailer)

{
  byte bVar1;
  int iVar2;
  nghttp2_stream *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  undefined4 in_R8D;
  uint8_t c;
  size_t i;
  int rv;
  uint8_t *in_stack_ffffffffffffffa8;
  nghttp2_hd_nv *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined8 in_stack_ffffffffffffffc8;
  ulong uVar3;
  int local_4;
  
  iVar2 = nghttp2_check_header_name
                    (*(uint8_t **)((in_RCX->pq_entry).index + 0x10),
                     *(size_t *)((in_RCX->pq_entry).index + 0x18));
  if (iVar2 == 0) {
    if ((*(long *)((in_RCX->pq_entry).index + 0x18) != 0) &&
       (**(char **)((in_RCX->pq_entry).index + 0x10) == ':')) {
      return -0x213;
    }
    uVar3 = 0;
    while( true ) {
      if (*(ulong *)((in_RCX->pq_entry).index + 0x18) <= uVar3) {
        *(uint *)(in_RSI + 0xd4) = *(uint *)(in_RSI + 0xd4) | 0x40;
        return -0x69;
      }
      bVar1 = *(byte *)(*(long *)((in_RCX->pq_entry).index + 0x10) + uVar3);
      if ((0x40 < bVar1) && (bVar1 < 0x5b)) break;
      uVar3 = uVar3 + 1;
    }
    return -0x213;
  }
  iVar2 = *(int *)&(in_RCX->obq).mem;
  if (iVar2 != 0) {
    if (iVar2 == 1) {
      iVar2 = nghttp2_check_method((uint8_t *)(in_RCX->obq).q[2],(size_t)(in_RCX->obq).q[3]);
      goto LAB_00127068;
    }
    if (iVar2 == 3) {
      iVar2 = nghttp2_check_path((uint8_t *)(in_RCX->obq).q[2],(size_t)(in_RCX->obq).q[3]);
      goto LAB_00127068;
    }
    if (iVar2 == 5) {
      iVar2 = check_scheme((uint8_t *)(in_RCX->obq).q[2],(size_t)(in_RCX->obq).q[3]);
      goto LAB_00127068;
    }
    if (iVar2 != 0x25) {
      if (((iVar2 == 0x42) && ((*(byte *)(in_RSI + 0xd8) & 0x40) != 0)) &&
         (iVar2 = lws((uint8_t *)(in_RCX->obq).q[2],(size_t)(in_RCX->obq).q[3]), iVar2 != 0)) {
        iVar2 = 0;
      }
      else if ((*(byte *)(in_RSI + 0xd8) & 0x40) == 0) {
        iVar2 = nghttp2_check_header_value_rfc9113(in_stack_ffffffffffffffa8,0x127062);
      }
      else {
        iVar2 = nghttp2_check_header_value((uint8_t *)(in_RCX->obq).q[2],(size_t)(in_RCX->obq).q[3])
        ;
      }
      goto LAB_00127068;
    }
  }
  if ((*(char *)(in_RDI + 0xb74) == '\0') && (*(char *)(in_RDX + 0xc) != '\x05')) {
    if ((*(byte *)(in_RSI + 0xd8) & 0x40) == 0) {
      iVar2 = nghttp2_check_header_value_rfc9113(in_stack_ffffffffffffffa8,0x126f93);
    }
    else {
      iVar2 = nghttp2_check_header_value((uint8_t *)(in_RCX->obq).q[2],(size_t)(in_RCX->obq).q[3]);
    }
  }
  else {
    iVar2 = check_authority((uint8_t *)(in_RCX->obq).q[2],(size_t)(in_RCX->obq).q[3]);
  }
LAB_00127068:
  if (iVar2 == 0) {
    if (*(long *)((in_RCX->pq_entry).index + 0x18) == 0) {
      __assert_fail("nv->name->len > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_http.c"
                    ,0x1f6,
                    "int nghttp2_http_on_header(nghttp2_session *, nghttp2_stream *, nghttp2_frame *, nghttp2_hd_nv *, int)"
                   );
    }
    if (**(char **)((in_RCX->pq_entry).index + 0x10) == ':') {
      local_4 = -0x213;
    }
    else {
      *(uint *)(in_RSI + 0xd4) = *(uint *)(in_RSI + 0xd4) | 0x40;
      local_4 = -0x69;
    }
  }
  else if ((*(char *)(in_RDI + 0xb74) == '\0') && (*(char *)(in_RDX + 0xc) != '\x05')) {
    local_4 = http_response_on_header
                        ((nghttp2_stream *)
                         CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                         in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  }
  else {
    local_4 = http_request_on_header
                        (in_RCX,(nghttp2_hd_nv *)CONCAT44(in_R8D,iVar2),
                         (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                         (int)in_stack_ffffffffffffffc8);
  }
  return local_4;
}

Assistant:

int nghttp2_http_on_header(nghttp2_session *session, nghttp2_stream *stream,
                           nghttp2_frame *frame, nghttp2_hd_nv *nv,
                           int trailer) {
  int rv;

  /* We are strict for pseudo header field.  One bad character should
     lead to fail.  OTOH, we should be a bit forgiving for regular
     headers, since existing public internet has so much illegal
     headers floating around and if we kill the stream because of
     this, we may disrupt many web sites and/or libraries.  So we
     become conservative here, and just ignore those illegal regular
     headers. */
  if (!nghttp2_check_header_name(nv->name->base, nv->name->len)) {
    size_t i;
    if (nv->name->len > 0 && nv->name->base[0] == ':') {
      return NGHTTP2_ERR_HTTP_HEADER;
    }
    /* header field name must be lower-cased without exception */
    for (i = 0; i < nv->name->len; ++i) {
      uint8_t c = nv->name->base[i];
      if ('A' <= c && c <= 'Z') {
        return NGHTTP2_ERR_HTTP_HEADER;
      }
    }
    /* When ignoring regular headers, we set this flag so that we
       still enforce header field ordering rule for pseudo header
       fields. */
    stream->http_flags |= NGHTTP2_HTTP_FLAG_PSEUDO_HEADER_DISALLOWED;
    return NGHTTP2_ERR_IGN_HTTP_HEADER;
  }

  switch (nv->token) {
  case NGHTTP2_TOKEN__METHOD:
    rv = nghttp2_check_method(nv->value->base, nv->value->len);
    break;
  case NGHTTP2_TOKEN__PATH:
    rv = nghttp2_check_path(nv->value->base, nv->value->len);
    break;
  case NGHTTP2_TOKEN__AUTHORITY:
  case NGHTTP2_TOKEN_HOST:
    if (session->server || frame->hd.type == NGHTTP2_PUSH_PROMISE) {
      rv = check_authority(nv->value->base, nv->value->len);
    } else if (
      stream->flags &
      NGHTTP2_STREAM_FLAG_NO_RFC9113_LEADING_AND_TRAILING_WS_VALIDATION) {
      rv = nghttp2_check_header_value(nv->value->base, nv->value->len);
    } else {
      rv = nghttp2_check_header_value_rfc9113(nv->value->base, nv->value->len);
    }
    break;
  case NGHTTP2_TOKEN__SCHEME:
    rv = check_scheme(nv->value->base, nv->value->len);
    break;
  case NGHTTP2_TOKEN__PROTOCOL:
    /* Check the value consists of just white spaces, which was done
       in check_pseudo_header before
       nghttp2_check_header_value_rfc9113 has been introduced. */
    if ((stream->flags &
         NGHTTP2_STREAM_FLAG_NO_RFC9113_LEADING_AND_TRAILING_WS_VALIDATION) &&
        lws(nv->value->base, nv->value->len)) {
      rv = 0;
      break;
    }
    /* fall through */
  default:
    if (stream->flags &
        NGHTTP2_STREAM_FLAG_NO_RFC9113_LEADING_AND_TRAILING_WS_VALIDATION) {
      rv = nghttp2_check_header_value(nv->value->base, nv->value->len);
    } else {
      rv = nghttp2_check_header_value_rfc9113(nv->value->base, nv->value->len);
    }
  }

  if (rv == 0) {
    assert(nv->name->len > 0);
    if (nv->name->base[0] == ':') {
      return NGHTTP2_ERR_HTTP_HEADER;
    }
    /* When ignoring regular headers, we set this flag so that we
       still enforce header field ordering rule for pseudo header
       fields. */
    stream->http_flags |= NGHTTP2_HTTP_FLAG_PSEUDO_HEADER_DISALLOWED;
    return NGHTTP2_ERR_IGN_HTTP_HEADER;
  }

  if (session->server || frame->hd.type == NGHTTP2_PUSH_PROMISE) {
    return http_request_on_header(stream, nv, trailer,
                                  session->server &&
                                    session->pending_enable_connect_protocol);
  }

  return http_response_on_header(stream, nv, trailer);
}